

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

void Llb_CoreSetVarMaps(Llb_Img_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Aig_Man_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  Vec_Int_t *pVVar9;
  int *__s_00;
  Vec_Int_t *pVVar10;
  int *__s_01;
  Vec_Int_t *pVVar11;
  int *__s_02;
  long lVar12;
  int iVar13;
  
  pVVar4 = p->vVarsCs;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsCs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x245,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  pVVar5 = p->vVarsNs;
  if (pVVar5 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsNs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x246,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x247,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x248,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Cs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x249,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x24a,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  pAVar6 = p->pAig;
  iVar1 = pAVar6->vObjs->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar13;
  if (iVar13 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar13 << 2);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  p->vCs2Glo = pVVar8;
  iVar1 = pAVar6->vObjs->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar13;
  if (iVar13 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar9->pArray = __s_00;
  pVVar9->nSize = iVar1;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0xff,(long)iVar1 << 2);
  }
  p->vNs2Glo = pVVar9;
  iVar1 = pAVar6->nRegs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar13;
  if (iVar13 == 0) {
    __s_01 = (int *)0x0;
  }
  else {
    __s_01 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar10->pArray = __s_01;
  pVVar10->nSize = iVar1;
  if (__s_01 != (int *)0x0) {
    memset(__s_01,0xff,(long)iVar1 << 2);
  }
  p->vGlo2Cs = pVVar10;
  iVar1 = pAVar6->nRegs;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar13;
  if (iVar13 == 0) {
    __s_02 = (int *)0x0;
  }
  else {
    __s_02 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar11->pArray = __s_02;
  pVVar11->nSize = iVar1;
  if (__s_02 != (int *)0x0) {
    memset(__s_02,0xff,(long)iVar1 << 2);
  }
  p->vGlo2Ns = pVVar11;
  if (0 < pAVar6->nRegs) {
    lVar12 = 0;
    do {
      if ((pVVar4->nSize <= lVar12) || (pVVar5->nSize <= lVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = pVVar4->pArray[lVar12];
      if (((int)uVar2 < 0) || (iVar1 = pAVar6->vObjs->nSize, iVar1 <= (int)uVar2)) {
        __assert_fail("iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                      ,0x253,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
      }
      uVar3 = pVVar5->pArray[lVar12];
      if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) {
        __assert_fail("iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                      ,0x254,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
      }
      if (pVVar8->nSize <= (int)uVar2) goto LAB_0081ffa8;
      __s[uVar2] = (int)lVar12;
      if (((pVVar9->nSize <= (int)uVar3) || (__s_00[uVar3] = (int)lVar12, pVVar10->nSize <= lVar12))
         || (__s_01[lVar12] = uVar2, pVVar11->nSize <= lVar12)) goto LAB_0081ffa8;
      __s_02[lVar12] = uVar3;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar6->nRegs);
  }
  if (0 < pAVar6->nTruePis) {
    pVVar7 = pAVar6->vCis;
    lVar12 = 0;
    do {
      if (pVVar7->nSize <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar7->pArray[lVar12] + 0x24);
      if (((long)iVar1 < 0) || (pVVar8->nSize <= iVar1)) {
LAB_0081ffa8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar1] = pAVar6->nRegs + (int)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar6->nTruePis);
  }
  return;
}

Assistant:

void Llb_CoreSetVarMaps( Llb_Img_t * p )
{
    Aig_Obj_t * pObj;
    int i, iVarCs, iVarNs;
    assert( p->vVarsCs != NULL );
    assert( p->vVarsNs != NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vNs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vCs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vNs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        iVarCs = Vec_IntEntry( p->vVarsCs, i );
        iVarNs = Vec_IntEntry( p->vVarsNs, i );
        assert( iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig) );
        assert( iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig) );
        Vec_IntWriteEntry( p->vCs2Glo, iVarCs, i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarNs, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarCs );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarNs );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Vec_IntWriteEntry( p->vCs2Glo, Aig_ObjId(pObj), Aig_ManRegNum(p->pAig)+i );
}